

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

Vec_Str_t *
Bmc_CollapseOneOld2(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  int nCubeLim_00;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar1;
  Gia_Man_t *p_01;
  int local_48;
  int local_44;
  int nCubesOff;
  int nCubesOn;
  Vec_Str_t *vSopOff;
  Vec_Str_t *vSopOn;
  int fVerbose_local;
  int fReverse_local;
  int fCanon_local;
  int nBTLimit_local;
  int nCubeLim_local;
  Gia_Man_t *p_local;
  
  local_44 = 1000000000;
  local_48 = 1000000000;
  p_00 = (Gia_Man_t *)Bmc_CollapseOneInt2(p,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose,0);
  if (p_00 != (Gia_Man_t *)0x0) {
    local_44 = Vec_StrCountEntry((Vec_Str_t *)p_00,'\n');
  }
  pGVar1 = Gia_ManPo(p,0);
  Gia_ObjFlipFaninC0(pGVar1);
  nCubeLim_00 = Abc_MinInt(nCubeLim,local_44);
  p_01 = (Gia_Man_t *)Bmc_CollapseOneInt2(p,nCubeLim_00,nBTLimit,fCanon,fReverse,fVerbose,1);
  pGVar1 = Gia_ManPo(p,0);
  Gia_ObjFlipFaninC0(pGVar1);
  if (p_01 != (Gia_Man_t *)0x0) {
    local_48 = Vec_StrCountEntry((Vec_Str_t *)p_01,'\n');
  }
  p_local = p_01;
  if ((p_00 != (Gia_Man_t *)0x0) && (p_local = p_00, p_01 != (Gia_Man_t *)0x0)) {
    if (local_48 < local_44) {
      Vec_StrFree((Vec_Str_t *)p_00);
      p_local = p_01;
    }
    else {
      Vec_StrFree((Vec_Str_t *)p_01);
    }
  }
  return (Vec_Str_t *)p_local;
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld2( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    Vec_Str_t * vSopOn, * vSopOff;
    int nCubesOn = ABC_INFINITY;
    int nCubesOff = ABC_INFINITY;
    vSopOn = Bmc_CollapseOneInt2( p, nCubeLim, nBTLimit, fCanon, fReverse, fVerbose, 0 );
    if ( vSopOn )
        nCubesOn = Vec_StrCountEntry(vSopOn,'\n');
    Gia_ObjFlipFaninC0( Gia_ManPo(p, 0) );
    vSopOff = Bmc_CollapseOneInt2( p, Abc_MinInt(nCubeLim, nCubesOn), nBTLimit, fCanon, fReverse, fVerbose, 1 );
    Gia_ObjFlipFaninC0( Gia_ManPo(p, 0) );
    if ( vSopOff )
        nCubesOff = Vec_StrCountEntry(vSopOff,'\n');
    if ( vSopOn == NULL )
        return vSopOff;
    if ( vSopOff == NULL )
        return vSopOn;
    if ( nCubesOn <= nCubesOff )
    {
        Vec_StrFree( vSopOff );
        return vSopOn;
    }
    else
    {
        Vec_StrFree( vSopOn );
        return vSopOff;
    }
}